

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_type.hpp
# Opt level: O2

string * cpptrace::detail::exception_type_name_abi_cxx11_(void)

{
  long lVar1;
  string *in_RDI;
  allocator<char> local_31;
  string local_30;
  
  lVar1 = __cxa_current_exception_type();
  if (lVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,"<unknown>",(allocator<char> *)&local_30);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,*(char **)(lVar1 + 8) + (**(char **)(lVar1 + 8) == '*'),&local_31
              );
    demangle(in_RDI,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return in_RDI;
}

Assistant:

inline std::string exception_type_name() {
        #if defined(CPPTRACE_HAS_CXX_EXCEPTION_TYPE) && (IS_LIBSTDCXX || IS_LIBCXX)
         const std::type_info* t = abi::__cxa_current_exception_type();
         return t ? detail::demangle(t->name()) : "<unknown>";
        #else
         return "<unknown>";
        #endif
    }